

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiWindow *in_RDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiWindow *display_front_window;
  ImGuiWindow *focus_front_window;
  ImGuiContext *g;
  ImGuiWindow *local_38;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  ImGuiWindow *pIVar1;
  ImGuiID local_28;
  ImGuiID local_24;
  ImGuiContext *window_00;
  
  window_00 = GImGui;
  if (GImGui->NavWindow != in_RDI) {
    SetNavWindow(in_stack_ffffffffffffffd0);
    if ((in_RDI != (ImGuiWindow *)0x0) && ((window_00->NavDisableMouseHover & 1U) != 0)) {
      window_00->NavMousePosDirty = true;
    }
    if (in_RDI == (ImGuiWindow *)0x0) {
      local_24 = 0;
    }
    else {
      local_24 = in_RDI->NavLastIds[0];
    }
    window_00->NavId = local_24;
    window_00->NavLayer = ImGuiNavLayer_Main;
    if (in_RDI == (ImGuiWindow *)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = in_RDI->NavRootFocusScopeId;
    }
    window_00->NavFocusScopeId = local_28;
    window_00->NavIdIsAlive = false;
    ClosePopupsOverWindow(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  }
  if (in_RDI == (ImGuiWindow *)0x0) {
    pIVar1 = (ImGuiWindow *)0x0;
    local_38 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar1 = in_RDI->RootWindow;
    local_38 = in_RDI->RootWindow;
  }
  if ((((window_00->ActiveId != 0) && (window_00->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
      (window_00->ActiveIdWindow->RootWindow != pIVar1)) &&
     ((window_00->ActiveIdNoClearOnFocusLoss & 1U) == 0)) {
    ClearActiveID();
  }
  if ((in_RDI != (ImGuiWindow *)0x0) &&
     (BringWindowToFocusFront((ImGuiWindow *)window_00),
     ((in_RDI->Flags | local_38->Flags) & 0x2000U) == 0)) {
    BringWindowToDisplayFront((ImGuiWindow *)window_00);
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        SetNavWindow(window);
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavLayer = ImGuiNavLayer_Main;
        g.NavFocusScopeId = window ? window->NavRootFocusScopeId : 0;
        g.NavIdIsAlive = false;

        // Close popups if any
        ClosePopupsOverWindow(window, false);
    }

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindow != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL; // NB: In docking branch this is window->RootWindowDockStop
    ImGuiWindow* display_front_window = window ? window->RootWindow : NULL;

    // Steal active widgets. Some of the cases it triggers includes:
    // - Focus a window while an InputText in another window is active, if focus happens before the old InputText can run.
    // - When using Nav to activate menu items (due to timing of activating on press->new window appears->losing ActiveId)
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        if (!g.ActiveIdNoClearOnFocusLoss)
            ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}